

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O2

void __thiscall zmq::ctx_t::~ctx_t(ctx_t *this)

{
  io_threads_t *this_00;
  io_thread_t *this_01;
  reaper_t *this_02;
  size_type i_1;
  size_type i;
  long lVar1;
  long lVar2;
  
  if ((this->_sockets)._items.
      super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->_sockets)._items.
      super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_sockets.empty ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ctx.cpp"
            ,0x74);
    fflush(_stderr);
    zmq_abort("_sockets.empty ()");
  }
  this_00 = &this->_io_threads;
  lVar2 = (long)(this->_io_threads).
                super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_io_threads).
                super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
    io_thread_t::stop((this_00->
                      super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar1]);
  }
  for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
    this_01 = (this_00->super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>)
              ._M_impl.super__Vector_impl_data._M_start[lVar1];
    if (this_01 != (io_thread_t *)0x0) {
      io_thread_t::~io_thread_t(this_01);
    }
    operator_delete(this_01,0xe0);
    (this_00->super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar1] = (io_thread_t *)0x0;
  }
  this_02 = this->_reaper;
  if (this_02 != (reaper_t *)0x0) {
    reaper_t::~reaper_t(this_02);
  }
  operator_delete(this_02,0xf0);
  this->_reaper = (reaper_t *)0x0;
  random_close();
  this->_tag = 0xdeadbeef;
  mutex_t::~mutex_t(&this->_endpoints_sync);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::ctx_t::pending_connection_t>_>_>
  ::~_Rb_tree(&(this->_pending_connections)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
  ::~_Rb_tree(&(this->_endpoints)._M_t);
  mailbox_t::~mailbox_t(&this->_term_mailbox);
  std::_Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>::~_Vector_base
            (&(this->_slots).super__Vector_base<zmq::i_mailbox_*,_std::allocator<zmq::i_mailbox_*>_>
            );
  std::_Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>::~_Vector_base
            (&this_00->super__Vector_base<zmq::io_thread_t_*,_std::allocator<zmq::io_thread_t_*>_>);
  mutex_t::~mutex_t(&this->_slot_sync);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_empty_slots).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>::~_Vector_base
            ((_Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_> *)
             &this->_sockets);
  thread_ctx_t::~thread_ctx_t(&this->super_thread_ctx_t);
  return;
}

Assistant:

zmq::ctx_t::~ctx_t ()
{
    //  Check that there are no remaining _sockets.
    zmq_assert (_sockets.empty ());

    //  Ask I/O threads to terminate. If stop signal wasn't sent to I/O
    //  thread subsequent invocation of destructor would hang-up.
    const io_threads_t::size_type io_threads_size = _io_threads.size ();
    for (io_threads_t::size_type i = 0; i != io_threads_size; i++) {
        _io_threads[i]->stop ();
    }

    //  Wait till I/O threads actually terminate.
    for (io_threads_t::size_type i = 0; i != io_threads_size; i++) {
        LIBZMQ_DELETE (_io_threads[i]);
    }

    //  Deallocate the reaper thread object.
    LIBZMQ_DELETE (_reaper);

    //  The mailboxes in _slots themselves were deallocated with their
    //  corresponding io_thread/socket objects.

    //  De-initialise crypto library, if needed.
    zmq::random_close ();

#ifdef ZMQ_USE_NSS
    NSS_Shutdown ();
#endif

#ifdef ZMQ_USE_GNUTLS
    gnutls_global_deinit ();
#endif

    //  Remove the tag, so that the object is considered dead.
    _tag = ZMQ_CTX_TAG_VALUE_BAD;
}